

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O1

size_t __thiscall std::hash<StringPiece>::operator()(hash<StringPiece> *this,StringPiece key)

{
  uint uVar1;
  size_t sVar2;
  byte *pbVar3;
  
  sVar2 = key.len_;
  pbVar3 = (byte *)key.str_;
  uVar1 = (uint)key.len_ ^ 0xdecafbad;
  do {
    switch(sVar2) {
    case 3:
      uVar1 = uVar1 ^ (uint)pbVar3[2] << 0x10;
    case 2:
      uVar1 = uVar1 ^ (uint)pbVar3[1] << 8;
    case 1:
      uVar1 = (*pbVar3 ^ uVar1) * 0x5bd1e995;
    case 0:
      uVar1 = (uVar1 >> 0xd ^ uVar1) * 0x5bd1e995;
      return (ulong)(uVar1 >> 0xf ^ uVar1);
    default:
      uVar1 = uVar1 * 0x5bd1e995 ^
              ((uint)(*(int *)pbVar3 * 0x5bd1e995) >> 0x18 ^ *(int *)pbVar3 * 0x5bd1e995) *
              0x5bd1e995;
      pbVar3 = pbVar3 + 4;
      sVar2 = sVar2 - 4;
    }
  } while( true );
}

Assistant:

static inline
unsigned int MurmurHash2(const void* key, size_t len) {
  static const unsigned int seed = 0xDECAFBAD;
  const unsigned int m = 0x5bd1e995;
  const int r = 24;
  unsigned int h = seed ^ len;
  const unsigned char* data = (const unsigned char*)key;
  while (len >= 4) {
    unsigned int k;
    memcpy(&k, data, sizeof k);
    k *= m;
    k ^= k >> r;
    k *= m;
    h *= m;
    h ^= k;
    data += 4;
    len -= 4;
  }
  switch (len) {
  case 3: h ^= data[2] << 16;
          NINJA_FALLTHROUGH;
  case 2: h ^= data[1] << 8;
          NINJA_FALLTHROUGH;
  case 1: h ^= data[0];
    h *= m;
  };
  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;
  return h;
}